

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcBuildingElementType::~IfcBuildingElementType
          (IfcBuildingElementType *this)

{
  ~IfcBuildingElementType
            ((IfcBuildingElementType *)
             &this[-1].super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x28);
  return;
}

Assistant:

IfcBuildingElementType() : Object("IfcBuildingElementType") {}